

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.c
# Opt level: O2

char * ecs_module_path_from_c(char *c_name)

{
  ushort **ppuVar1;
  __int32_t **pp_Var2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  char ch;
  ecs_strbuf_t str;
  
  lVar5 = 0;
  memset(&str,0,0x440);
  while( true ) {
    ch = c_name[lVar5];
    lVar4 = (long)ch;
    if (lVar4 == 0) break;
    ppuVar1 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar1 + lVar4 * 2 + 1) & 1) != 0) {
      pp_Var2 = __ctype_tolower_loc();
      ch = ecs_to_i8((long)(*pp_Var2)[lVar4]);
      if (lVar5 != 0) {
        ecs_strbuf_appendstrn(&str,".",1);
      }
    }
    ecs_strbuf_appendstrn(&str,&ch,1);
    lVar5 = lVar5 + 1;
  }
  pcVar3 = ecs_strbuf_get(&str);
  return pcVar3;
}

Assistant:

char* ecs_module_path_from_c(
    const char *c_name)
{
    ecs_strbuf_t str = ECS_STRBUF_INIT;
    const char *ptr;
    char ch;

    for (ptr = c_name; (ch = *ptr); ptr++) {
        if (isupper(ch)) {
            ch = ecs_to_i8(tolower(ch));
            if (ptr != c_name) {
                ecs_strbuf_appendstrn(&str, ".", 1);
            }
        }

        ecs_strbuf_appendstrn(&str, &ch, 1);
    }

    return ecs_strbuf_get(&str);
}